

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_helper.c
# Opt level: O3

void helper_gvec_sqadd_d_aarch64(void *vd,void *vq,void *vn,void *vm,uint32_t desc)

{
  ulong uVar1;
  ulong uVar2;
  byte bVar3;
  byte bVar4;
  uint32_t *qc;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  
  uVar7 = desc * 8 & 0xff;
  uVar8 = uVar7 + 8;
  uVar5 = (ulong)uVar8;
  uVar6 = 0;
  bVar4 = 0;
  do {
    bVar3 = bVar4;
    uVar1 = *(ulong *)((long)vn + uVar6 * 8);
    uVar2 = *(ulong *)((long)vm + uVar6 * 8);
    uVar9 = uVar1 + uVar2;
    uVar10 = 0x8000000000000000;
    if (-1 < (long)uVar1) {
      uVar10 = 0x7fffffffffffffff;
    }
    bVar11 = (long)((uVar9 ^ uVar1) & ~(uVar2 ^ uVar1)) < 0;
    if (!bVar11) {
      uVar10 = uVar9;
    }
    *(ulong *)((long)vd + uVar6 * 8) = uVar10;
    uVar6 = uVar6 + 1;
    bVar4 = bVar3 | bVar11;
  } while (uVar8 >> 3 != uVar6);
  if ((bool)(bVar3 | bVar11)) {
    *(undefined4 *)vq = 1;
  }
  uVar8 = desc >> 2 & 0xf8;
  if (uVar7 < uVar8) {
    uVar9 = (ulong)(uVar8 + 8);
    uVar6 = uVar5 + 8;
    if (uVar5 + 8 < uVar9) {
      uVar6 = uVar9;
    }
    memset((void *)((long)vd + uVar5),0,(~uVar5 + uVar6 & 0xfffffffffffffff8) + 8);
    return;
  }
  return;
}

Assistant:

void HELPER(gvec_sqadd_d)(void *vd, void *vq, void *vn,
                          void *vm, uint32_t desc)
{
    intptr_t i, oprsz = simd_oprsz(desc);
    int64_t *d = vd, *n = vn, *m = vm;
    bool q = false;

    for (i = 0; i < oprsz / 8; i++) {
        int64_t nn = n[i], mm = m[i], dd = nn + mm;
        if (((dd ^ nn) & ~(nn ^ mm)) & INT64_MIN) {
            dd = (nn >> 63) ^ ~INT64_MIN;
            q = true;
        }
        d[i] = dd;
    }
    if (q) {
        uint32_t *qc = vq;
        qc[0] = 1;
    }
    clear_tail(d, oprsz, simd_maxsz(desc));
}